

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator>
* __thiscall
Lib::
OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator>
::operator=(OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator>
            *this,OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator>
                  *other)

{
  byte *in_RSI;
  OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator>
  *in_RDI;
  LeafIterator *t;
  EVP_PKEY_CTX local_38 [40];
  byte *local_10;
  
  local_10 = in_RSI;
  if ((in_RDI->_isSome & 1U) != 0) {
    unwrap((OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator>
            *)0x431387);
    Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator::
    ~LeafIterator((LeafIterator *)0x43138f);
  }
  if ((*local_10 & 1) != 0) {
    t = (LeafIterator *)&in_RDI->_elem;
    unwrap((OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator>
            *)0x4313b0);
    move_if_value<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator,_true>
              (t);
    MaybeUninit<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator>
    ::init((MaybeUninit<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator>
            *)t,local_38);
    Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::LeafIterator::
    ~LeafIterator((LeafIterator *)0x4313d5);
  }
  in_RDI->_isSome = (bool)(*local_10 & 1);
  return in_RDI;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }